

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intervals.cpp
# Opt level: O0

void __thiscall
IntervalsTest_TestOverlapDescendingSequence_Test::TestBody
          (IntervalsTest_TestOverlapDescendingSequence_Test *this)

{
  allocator<int> *this_00;
  initializer_list<int> __l;
  bool bVar1;
  char *message;
  AssertHelper local_f0;
  Message local_e8;
  vector<int,_std::allocator<int>_> local_e0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  int local_b0 [2];
  iterator local_a8;
  size_type local_a0;
  undefined1 local_98 [8];
  vector<int,_std::allocator<int>_> expected;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_34 [3];
  undefined1 local_28 [8];
  vector<wasm::Interval,_std::allocator<wasm::Interval>_> intervals;
  IntervalsTest_TestOverlapDescendingSequence_Test *this_local;
  
  intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<wasm::Interval,_std::allocator<wasm::Interval>_>::vector
            ((vector<wasm::Interval,_std::allocator<wasm::Interval>_> *)local_28);
  local_34[2] = 9;
  local_34[1] = 0xf;
  local_34[0] = 5;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)local_28,local_34 + 2,
             local_34 + 1,local_34);
  local_48 = 8;
  local_4c = 0xb;
  local_50 = 1;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)local_28,
             &stack0xffffffffffffffb8,&stack0xffffffffffffffb4,&stack0xffffffffffffffb0);
  local_54 = 3;
  local_58 = 0xf;
  local_5c = 5;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)local_28,
             &stack0xffffffffffffffac,&stack0xffffffffffffffa8,&stack0xffffffffffffffa4);
  local_60 = 3;
  local_64 = 6;
  local_68 = 2;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)local_28,
             &stack0xffffffffffffffa0,&stack0xffffffffffffff9c,&stack0xffffffffffffff98);
  local_6c = 2;
  local_70 = 10;
  local_74 = 3;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)local_28,
             &stack0xffffffffffffff94,&stack0xffffffffffffff90,&stack0xffffffffffffff8c);
  local_78 = 0;
  expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 3;
  expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 6;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)local_28,
             &stack0xffffffffffffff88,
             (int *)((long)&expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4),
             (int *)&expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  local_b0[0] = 5;
  local_b0[1] = 2;
  local_a8 = local_b0;
  local_a0 = 2;
  this_00 = (allocator<int> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<int>::allocator(this_00);
  __l._M_len = local_a0;
  __l._M_array = local_a8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_98,__l,this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  ::wasm::IntervalProcessor::filterOverlaps((vector *)&local_e0);
  testing::internal::EqHelper::
  Compare<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_c8,"IntervalProcessor::filterOverlaps(intervals)","expected",
             &local_e0,(vector<int,_std::allocator<int>_> *)local_98);
  std::vector<int,_std::allocator<int>_>::~vector(&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/intervals.cpp"
               ,0x3c,message);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_98);
  std::vector<wasm::Interval,_std::allocator<wasm::Interval>_>::~vector
            ((vector<wasm::Interval,_std::allocator<wasm::Interval>_> *)local_28);
  return;
}

Assistant:

TEST(IntervalsTest, TestOverlapDescendingSequence) {
  std::vector<Interval> intervals;
  intervals.emplace_back(9, 15, 5);
  intervals.emplace_back(8, 11, 1);
  intervals.emplace_back(3, 15, 5);
  intervals.emplace_back(3, 6, 2);
  intervals.emplace_back(2, 10, 3);
  intervals.emplace_back(0, 3, 6);
  std::vector<int> expected{5, 2};
  ASSERT_EQ(IntervalProcessor::filterOverlaps(intervals), expected);
}